

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O0

U16 __thiscall USBPacket::CalcCRC16(USBPacket *this)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  byte local_1d;
  ushort local_1a;
  U8 crc_bit;
  U8 data_bit;
  U8 shift_register;
  U16 polynom;
  ulong uStack_18;
  U16 crc_register;
  size_t counter;
  USBPacket *this_local;
  
  local_1a = 0xffff;
  for (uStack_18 = 2;
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mData),
      uStack_18 < sVar2 - 2; uStack_18 = uStack_18 + 1) {
    for (local_1d = 1; local_1d != 0; local_1d = local_1d << 1) {
      pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->mData,uStack_18);
      bVar1 = (byte)local_1a;
      local_1a = (ushort)((int)(uint)local_1a >> 1);
      if (((*pbVar3 & local_1d) != 0) != (bool)(bVar1 & 1)) {
        local_1a = local_1a ^ 0xa001;
      }
    }
  }
  return local_1a ^ 0xffff;
}

Assistant:

U16 USBPacket::CalcCRC16() const
{
    size_t counter;
    U16 crc_register = 0xffff;
    U16 polynom = 0xA001;
    U8 shift_register, data_bit, crc_bit;

    for( counter = 2; counter < mData.size() - 2; counter++ )
    {
        for( shift_register = 0x01; shift_register > 0x00; shift_register <<= 1 )
        {
            data_bit = ( mData[ counter ] & shift_register ) ? 1 : 0;
            crc_bit = crc_register & 1;

            crc_register >>= 1;

            if( data_bit ^ crc_bit )
                crc_register ^= polynom;
        }
    }

    return ~crc_register;
}